

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

void nhdp_db_neighbor_set_originator(nhdp_neighbor *neigh,netaddr *originator)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  uint8_t uVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  list_entity *plVar9;
  
  iVar6 = bcmp(neigh,originator,0x12);
  if (iVar6 != 0) {
    if ((neigh->originator)._type != '\0') {
      avl_remove(&_neigh_originator_tree,&neigh->_originator_node);
      plVar9 = &neigh->_links;
      while (plVar9 = plVar9->next, plVar9->prev != (neigh->_links).prev) {
        avl_remove(plVar9[-0xc].next + 0x1f,plVar9 + 1);
      }
    }
    lVar7 = avl_find(&_neigh_originator_tree,originator);
    if (lVar7 != 0) {
      avl_remove(&_neigh_originator_tree,lVar7);
      plVar8 = (long *)(lVar7 + -0x70);
      while (plVar8 = (long *)*plVar8, plVar8[1] != *(long *)(lVar7 + -0x68)) {
        avl_remove(plVar8[-0x18] + 0x1f0,plVar8 + 2);
      }
      *(undefined8 *)(lVar7 + -0xa8) = 0;
      *(undefined8 *)(lVar7 + -0xa0) = 0;
      *(undefined2 *)(lVar7 + -0x98) = 0;
    }
    uVar5 = originator->_prefix_len;
    (neigh->originator)._type = originator->_type;
    (neigh->originator)._prefix_len = uVar5;
    uVar1 = *(undefined4 *)(originator->_addr + 4);
    uVar2 = *(undefined4 *)(originator->_addr + 8);
    uVar3 = *(undefined4 *)(originator->_addr + 0xc);
    *(undefined4 *)(neigh->originator)._addr = *(undefined4 *)originator->_addr;
    *(undefined4 *)((neigh->originator)._addr + 4) = uVar1;
    *(undefined4 *)((neigh->originator)._addr + 8) = uVar2;
    *(undefined4 *)((neigh->originator)._addr + 0xc) = uVar3;
    if (originator->_type != '\0') {
      avl_insert(&_neigh_originator_tree,&neigh->_originator_node);
      plVar9 = &neigh->_links;
      while (plVar9 = plVar9->next, plVar9->prev != (neigh->_links).prev) {
        avl_insert(plVar9[-0xc].next + 0x1f,plVar9 + 1);
      }
    }
    oonf_class_event(&_neigh_info,neigh,OONF_OBJECT_CHANGED);
    uVar5 = originator->_prefix_len;
    (neigh->_old_originator)._type = originator->_type;
    (neigh->_old_originator)._prefix_len = uVar5;
    uVar4 = *(undefined8 *)(originator->_addr + 8);
    *(undefined8 *)(neigh->_old_originator)._addr = *(undefined8 *)originator->_addr;
    *(undefined8 *)((neigh->_old_originator)._addr + 8) = uVar4;
  }
  return;
}

Assistant:

void
nhdp_db_neighbor_set_originator(struct nhdp_neighbor *neigh, const struct netaddr *originator) {
  struct nhdp_neighbor *neigh2;
  struct nhdp_link *lnk;

  if (memcmp(&neigh->originator, originator, sizeof(*originator)) == 0) {
    /* same originator, nothing to do */
    return;
  }

  if (netaddr_get_address_family(&neigh->originator) != AF_UNSPEC) {
    /* different originator, remove from tree */
    avl_remove(&_neigh_originator_tree, &neigh->_originator_node);

    list_for_each_element(&neigh->_links, lnk, _neigh_node) {
      /* remove links from interface specific tree */
      avl_remove(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }
  }

  neigh2 = nhdp_db_neighbor_get_by_originator(originator);
  if (neigh2) {
    /* different neighbor has this originator, invalidate it */
    avl_remove(&_neigh_originator_tree, &neigh2->_originator_node);

    list_for_each_element(&neigh2->_links, lnk, _neigh_node) {
      /* remove links from interface specific tree */
      avl_remove(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }

    netaddr_invalidate(&neigh2->originator);
  }

  /* copy originator address into neighbor */
  memcpy(&neigh->originator, originator, sizeof(*originator));

  if (netaddr_get_address_family(originator) != AF_UNSPEC) {
    /* add to tree if new originator is valid */
    avl_insert(&_neigh_originator_tree, &neigh->_originator_node);

    list_for_each_element(&neigh->_links, lnk, _neigh_node) {
      /* remove links from interface specific tree */
      avl_insert(&lnk->local_if->_link_originators, &lnk->_originator_node);
    }
  }

  /* inform everyone */
  oonf_class_event(&_neigh_info, neigh, OONF_OBJECT_CHANGED);

  /* overwrite "old originator" */
  memcpy(&neigh->_old_originator, originator, sizeof(*originator));
}